

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

ssize_t __thiscall utf8stream::write(utf8stream *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  int carry;
  uchar dst [512];
  int local_23c;
  uchar local_238 [520];
  
  iVar4 = (int)__buf;
  uVar5 = 0;
  if (((iVar4 != 0) && (uVar5 = 0, CONCAT44(in_register_00000034,__fd) != 0)) &&
     (this->writing != false)) {
    uVar5 = 0;
    do {
      if (iVar4 - uVar5 == 0 || iVar4 < (int)uVar5) break;
      local_23c = 0;
      uVar2 = encodeutf8(local_238,0x200,
                         (uchar *)((long)(int)uVar5 + CONCAT44(in_register_00000034,__fd)),
                         iVar4 - uVar5,&local_23c);
      if ((int)uVar2 < 1) {
LAB_0015b167:
        uVar5 = uVar5 + local_23c;
        bVar1 = true;
      }
      else {
        uVar3 = (*this->file->_vptr_stream[10])(this->file,local_238,(ulong)uVar2);
        if (uVar3 == uVar2) goto LAB_0015b167;
        if (this->writing == true) {
          this->writing = false;
        }
        bVar1 = false;
      }
    } while (bVar1);
    this->pos = this->pos + (long)(int)uVar5;
  }
  return (ulong)uVar5;
}

Assistant:

int write(const void *src, int len)
    {
        if(!writing || !src || !len) return 0;
        uchar dst[512];
        int next = 0;
        while(next < len)
        {
            int carry = 0, n = encodeutf8(dst, sizeof(dst), &((uchar *)src)[next], len - next, &carry);
            if(n > 0 && file->write(dst, n) != n) { stopwriting(); break; }
            next += carry;
        }
        pos += next;
        return next;
    }